

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_Test
::testBody(TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  TestTerminator *pTVar7;
  SimpleString local_1e8;
  SimpleString local_1d8;
  SimpleString local_1c8;
  SimpleString local_1b8;
  SimpleString local_1a8;
  SimpleString local_198;
  SimpleString local_188;
  SimpleString local_178;
  SimpleString local_168;
  SimpleString local_158;
  SimpleString local_148;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  MyTypeForTestingCopier local_68;
  MyTypeForTestingCopier copier;
  MyTypeForTesting actualObject2;
  MyTypeForTesting expectedObject2;
  undefined1 local_30 [8];
  MyTypeForTesting actualObject1;
  MyTypeForTesting expectedObject1;
  TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_Test
  *this_local;
  
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&actualObject1.value,0xb);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)local_30,0x16);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&actualObject2.value,0x21);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&copier,0x2c);
  MyTypeForTestingCopier::MyTypeForTestingCopier(&local_68);
  SimpleString::SimpleString(&local_78,"");
  pMVar2 = mock(&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_88,&local_68);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::SimpleString(&local_98,"");
  pMVar2 = mock(&local_98,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_a8);
  SimpleString::SimpleString(&local_b8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_c8,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_b8,&local_c8,
                              &actualObject1.value);
  SimpleString::SimpleString(&local_d8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_e8,"foobar");
  (**(code **)(*plVar3 + 0x38))(plVar3,&local_d8,&local_e8,&actualObject2.value);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::SimpleString(&local_f8,"");
  pMVar2 = mock(&local_f8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_108,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_108);
  SimpleString::SimpleString(&local_118,"MyTypeForTesting");
  SimpleString::SimpleString(&local_128,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_118,&local_128,local_30
                             );
  SimpleString::SimpleString(&local_138,"MyTypeForTesting");
  SimpleString::SimpleString(&local_148,"foobar");
  (**(code **)(*plVar3 + 0x30))(plVar3,&local_138,&local_148,&copier);
  SimpleString::~SimpleString(&local_148);
  SimpleString::~SimpleString(&local_138);
  SimpleString::~SimpleString(&local_128);
  SimpleString::~SimpleString(&local_118);
  SimpleString::~SimpleString(&local_108);
  SimpleString::~SimpleString(&local_f8);
  SimpleString::SimpleString(&local_158,"");
  pMVar2 = mock(&local_158,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_158);
  if (*expectedObject1._vptr_MyTypeForTesting == (_func_int *)0xb) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15c,pTVar7);
  }
  else {
    if (*expectedObject1._vptr_MyTypeForTesting != *expectedObject1._vptr_MyTypeForTesting) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x15c);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_168);
    pcVar5 = SimpleString::asCharString(&local_168);
    ::StringFrom((long)&local_178);
    pcVar6 = SimpleString::asCharString(&local_178);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15c,pTVar7);
    SimpleString::~SimpleString(&local_178);
    SimpleString::~SimpleString(&local_168);
  }
  if (*actualObject1._vptr_MyTypeForTesting == (_func_int *)0xb) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15d,pTVar7);
  }
  else {
    if (*actualObject1._vptr_MyTypeForTesting != *actualObject1._vptr_MyTypeForTesting) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x15d);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_188);
    pcVar5 = SimpleString::asCharString(&local_188);
    ::StringFrom((long)&local_198);
    pcVar6 = SimpleString::asCharString(&local_198);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15d,pTVar7);
    SimpleString::~SimpleString(&local_198);
    SimpleString::~SimpleString(&local_188);
  }
  if (*expectedObject2._vptr_MyTypeForTesting == (_func_int *)0x21) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15e,pTVar7);
  }
  else {
    if (*expectedObject2._vptr_MyTypeForTesting != *expectedObject2._vptr_MyTypeForTesting) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x15e);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_1a8);
    pcVar5 = SimpleString::asCharString(&local_1a8);
    ::StringFrom((long)&local_1b8);
    pcVar6 = SimpleString::asCharString(&local_1b8);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15e,pTVar7);
    SimpleString::~SimpleString(&local_1b8);
    SimpleString::~SimpleString(&local_1a8);
  }
  if (*actualObject2._vptr_MyTypeForTesting == (_func_int *)0x21) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15f,pTVar7);
  }
  else {
    if (*actualObject2._vptr_MyTypeForTesting != *actualObject2._vptr_MyTypeForTesting) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x15f);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_1c8);
    pcVar5 = SimpleString::asCharString(&local_1c8);
    ::StringFrom((long)&local_1d8);
    pcVar6 = SimpleString::asCharString(&local_1d8);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15f,pTVar7);
    SimpleString::~SimpleString(&local_1d8);
    SimpleString::~SimpleString(&local_1c8);
  }
  SimpleString::SimpleString(&local_1e8,"");
  pMVar2 = mock(&local_1e8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_1e8);
  MyTypeForTestingCopier::~MyTypeForTestingCopier(&local_68);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&copier);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&actualObject2.value);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)local_30);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&actualObject1.value);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds)
{
    MyTypeForTesting expectedObject1(11);
    MyTypeForTesting actualObject1(22);
    MyTypeForTesting expectedObject2(33);
    MyTypeForTesting actualObject2(44);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("foo")
        .withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &expectedObject1)
        .withOutputParameterOfTypeReturning("MyTypeForTesting", "foobar", &expectedObject2);
    mock().actualCall("foo")
        .withOutputParameterOfType("MyTypeForTesting", "bar", &actualObject1)
        .withOutputParameterOfType("MyTypeForTesting", "foobar", &actualObject2);

    mock().checkExpectations();
    CHECK_EQUAL(11, *(expectedObject1.value));
    CHECK_EQUAL(11, *(actualObject1.value));
    CHECK_EQUAL(33, *(expectedObject2.value));
    CHECK_EQUAL(33, *(actualObject2.value));

    mock().removeAllComparatorsAndCopiers();
}